

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_on_assertion_failure_tests.cpp
# Opt level: O0

void Sub1(void)

{
  bool bVar1;
  char *message;
  AssertionHelper local_200;
  Fixed local_1d0;
  int local_38 [2];
  undefined1 local_30 [8];
  AssertionResult iutest_ar;
  
  iutest::detail::AlwaysZero();
  local_38[1] = 2;
  local_38[0] = 1;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_30,"2","1",local_38 + 1,local_38);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    message = iutest::AssertionResult::message((AssertionResult *)local_30);
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/throw_on_assertion_failure_tests.cpp"
               ,0x1a,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

void Sub1(void)
{
    IUTEST_ASSERT_EQ(2, 1);
}